

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

bool __thiscall doublechecked::Roaring::contains(Roaring *this,uint32_t x)

{
  uint uVar1;
  iterator result;
  Roaring *in_RDI;
  bool ans;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  _Self local_18;
  byte local_d;
  
  local_d = roaring::Roaring::contains(in_RDI,in_stack_ffffffffffffffcc);
  uVar1 = (uint)local_d;
  local_18._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(key_type *)0x10f896
                 );
  result = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  std::operator!=(&local_18,(_Self *)&stack0xffffffffffffffe0);
  _assert_true((unsigned_long)result._M_node,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
               (char *)in_RDI,in_stack_ffffffffffffffcc);
  return (bool)(local_d & 1);
}

Assistant:

bool contains(uint32_t x) const {
        bool ans = plain.contains(x);
        assert_true(ans == (check.find(x) != check.end()));
        return ans;
    }